

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLESelect<signed_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  RLEScanState<signed_char> *this;
  data_ptr_t pdVar1;
  InternalException *this_00;
  ulong uVar2;
  rle_count_t *index_pointer;
  idx_t iVar3;
  idx_t iVar4;
  allocator local_71;
  data_ptr_t local_70;
  idx_t local_68;
  SelectionVector *local_60;
  idx_t local_58;
  string local_50;
  
  local_60 = sel;
  local_58 = sel_count;
  this = (RLEScanState<signed_char> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar1 = BufferHandle::Ptr(&this->handle);
  local_70 = pdVar1 + segment->offset + 8;
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)this->rle_count_offset + segment->offset);
  if ((vector_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[this->entry_pos] - this->position_in_entry)) {
    RLEScanConstant<signed_char>(this,index_pointer,(char *)local_70,0x800,result);
    return;
  }
  pdVar1 = result->data;
  local_68 = vector_count;
  Vector::SetVectorType(result,FLAT_VECTOR);
  iVar4 = 0;
  uVar2 = 0;
  while( true ) {
    if (local_58 == iVar4) {
      RLEScanState<signed_char>::SkipInternal(this,index_pointer,local_68 - uVar2);
      return;
    }
    iVar3 = iVar4;
    if (local_60->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)local_60->sel_vector[iVar4];
    }
    if (iVar3 < uVar2) break;
    RLEScanState<signed_char>::SkipInternal(this,index_pointer,iVar3 - uVar2);
    pdVar1[iVar4] = local_70[this->entry_pos];
    iVar4 = iVar4 + 1;
    uVar2 = iVar3;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Error in RLESelect - selection vector indices are not ordered",
             &local_71);
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void RLESelect(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
               const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run we don't need to select at all
	if (CanEmitConstantVector<true>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos], vector_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, vector_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t prev_idx = 0;
	for (idx_t i = 0; i < sel_count; i++) {
		auto next_idx = sel.get_index(i);
		if (next_idx < prev_idx) {
			throw InternalException("Error in RLESelect - selection vector indices are not ordered");
		}
		// skip forward to the next index
		scan_state.SkipInternal(index_pointer, next_idx - prev_idx);
		// read the element
		result_data[i] = data_pointer[scan_state.entry_pos];
		// move the next to the prev
		prev_idx = next_idx;
	}
	// skip the tail
	scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
}